

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> *this_00;
  string *__return_storage_ptr__;
  byte bVar1;
  char cVar2;
  pointer paVar3;
  PyTypeObject *pPVar4;
  handle obj;
  function_record *pfVar5;
  undefined8 uVar6;
  cpp_function *pcVar7;
  int iVar8;
  char *pcVar9;
  type_info *ptVar10;
  function_record *pfVar11;
  PyMethodDef *pPVar12;
  PyObject *pPVar13;
  PyObject *pPVar14;
  function_record *pfVar15;
  size_type *psVar16;
  object *object;
  pointer paVar17;
  ulong uVar18;
  function_record *pfVar19;
  bool bVar20;
  accessor<pybind11::detail::accessor_policies::str_attr> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  str local_138;
  type_info **local_130;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_128;
  ulong local_120;
  undefined1 local_118 [24];
  object local_100;
  cpp_function *local_f8;
  undefined1 local_f0 [8];
  string signature;
  capsule rec_capsule_1;
  undefined1 local_b0 [24];
  object local_98;
  _Alloc_hider local_90;
  object scope_module;
  allocator local_62;
  allocator local_61;
  ulong local_60;
  function_record *local_58;
  undefined1 local_50 [8];
  string signatures;
  
  pcVar9 = "";
  if (rec->name != (char *)0x0) {
    pcVar9 = rec->name;
  }
  local_130 = types;
  local_120 = args;
  local_f8 = this;
  pcVar9 = strdup(pcVar9);
  rec->name = pcVar9;
  if (rec->doc != (char *)0x0) {
    pcVar9 = strdup(rec->doc);
    rec->doc = pcVar9;
  }
  local_128 = &rec->args;
  paVar3 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> *
            )(signature.field_2._M_local_buf + 8);
  local_58 = rec;
  for (paVar17 = (rec->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start; pfVar19 = local_58, paVar17 != paVar3;
      paVar17 = paVar17 + 1) {
    if (paVar17->name != (char *)0x0) {
      pcVar9 = strdup(paVar17->name);
      paVar17->name = pcVar9;
    }
    if (paVar17->descr == (char *)0x0) {
      pPVar13 = (paVar17->value).m_ptr;
      if (pPVar13 != (PyObject *)0x0) {
        signatures._M_string_length = (size_type)anon_var_dwarf_3353b;
        signatures.field_2._M_allocated_capacity = 0;
        signatures._M_dataplus._M_p = (pointer)pPVar13;
        detail::
        object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
        operator()(this_00);
        cast<std::__cxx11::string>
                  ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                    *)local_f0,(pybind11 *)this_00,object);
        pcVar9 = strdup((char *)local_f0);
        paVar17->descr = pcVar9;
        std::__cxx11::string::~string((string *)local_f0);
        pybind11::object::~object((object *)this_00);
        pybind11::object::~object((object *)&signatures.field_2._M_allocated_capacity);
      }
    }
    else {
      pcVar9 = strdup(paVar17->descr);
      paVar17->descr = pcVar9;
    }
  }
  pcVar9 = local_58->name;
  iVar8 = strcmp(pcVar9,"__init__");
  if (iVar8 == 0) {
    bVar20 = true;
  }
  else {
    iVar8 = strcmp(pcVar9,"__setstate__");
    bVar20 = iVar8 == 0;
  }
  bVar1 = pfVar19->field_0x59;
  pfVar19->field_0x59 = bVar1 & 0xfe | bVar20;
  if (((bVar1 & 2) == 0 & bVar20) == 1) {
    std::__cxx11::string::string
              ((string *)local_f0,(char *)(pfVar19->scope).m_ptr[1].ob_type,(allocator *)local_50);
    std::__cxx11::string::string
              ((string *)local_50,pfVar19->name,(allocator *)(signature.field_2._M_local_buf + 8));
    uVar6 = _PyExc_FutureWarning;
    std::operator+(&local_158,"pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &local_158,"\' is using an old-style placement-new \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&signature.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff70,
                   "\' which has been deprecated. See the upgrade guide in pybind11\'s docs. This message is only visible when compiled in debug mode."
                  );
    PyErr_WarnEx(uVar6,signature.field_2._8_8_,0);
    std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)local_f0);
  }
  local_f0 = (undefined1  [8])&signature._M_string_length;
  signature._M_dataplus._M_p = (pointer)0x0;
  signature._M_string_length._0_1_ = 0;
  pcVar9 = text + 1;
  uVar18 = 0;
  __return_storage_ptr__ = (string *)(&signature.field_2._M_allocated_capacity + 1);
  local_60 = 0;
  do {
    cVar2 = pcVar9[-1];
    if (cVar2 == '%') {
      pPVar4 = (PyTypeObject *)local_130[local_60];
      if (pPVar4 == (PyTypeObject *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      local_50 = (undefined1  [8])pPVar4;
      ptVar10 = detail::get_type_info((type_index *)local_50,false);
      pfVar19 = local_58;
      local_60 = local_60 + 1;
      if (ptVar10 == (type_info *)0x0) {
        if ((uVar18 == 0 & (byte)local_58->field_0x59 >> 1) == 1) {
          local_b0._8_8_ = (local_58->scope).m_ptr;
          local_b0._16_8_ = "__module__";
          local_98.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff70,
                     (accessor<pybind11::detail::accessor_policies::str_attr> *)local_b0);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff70,".");
          local_118._8_8_ = (pfVar19->scope).m_ptr;
          local_118._16_8_ = "__qualname__";
          local_100.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    (&local_158,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_118
                    );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,__return_storage_ptr__,&local_158);
          std::__cxx11::string::append((string *)local_f0);
          std::__cxx11::string::~string((string *)local_50);
          std::__cxx11::string::~string((string *)&local_158);
          pybind11::object::~object(&local_100);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
          pybind11::object::~object(&local_98);
          uVar18 = 0;
        }
        else {
          pPVar4 = (pPVar4->ob_base).ob_base.ob_type;
          std::__cxx11::string::string
                    ((string *)local_50,
                     (char *)((long)&(pPVar4->ob_base).ob_base.ob_refcnt +
                             (ulong)((char)(pPVar4->ob_base).ob_base.ob_refcnt == '*')),
                     (allocator *)__return_storage_ptr__);
          detail::clean_type_id((string *)local_50);
          std::__cxx11::string::append((string *)local_f0);
          std::__cxx11::string::~string((string *)local_50);
        }
      }
      else {
        pPVar4 = ptVar10->type;
        local_b0._16_8_ = "__module__";
        local_98.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_b0._8_8_ = pPVar4;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff70,
                   (accessor<pybind11::detail::accessor_policies::str_attr> *)local_b0);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff70,".");
        local_118._16_8_ = "__qualname__";
        local_100.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_118._8_8_ = pPVar4;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_158,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_118);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,__return_storage_ptr__,&local_158);
        std::__cxx11::string::append((string *)local_f0);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string((string *)&local_158);
        pybind11::object::~object(&local_100);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
        pybind11::object::~object(&local_98);
      }
    }
    else if (cVar2 == '{') {
      if (*pcVar9 != '*') {
        paVar17 = (local_58->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((uVar18 < (ulong)((long)(local_58->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar17 >> 5
                              )) && (paVar17[uVar18].name != (char *)0x0)) ||
           ((local_58->field_0x59 & 0x40) != 0 && uVar18 == 0)) {
          std::__cxx11::string::append(local_f0);
        }
        else {
          std::__cxx11::to_string
                    (__return_storage_ptr__,uVar18 - (((byte)local_58->field_0x59 >> 6 & 1) != 0));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,"arg",__return_storage_ptr__);
          std::__cxx11::string::append((string *)local_f0);
          std::__cxx11::string::~string((string *)local_50);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
        }
        std::__cxx11::string::append(local_f0);
      }
    }
    else if (cVar2 == '}') {
      paVar17 = (local_58->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar18 < (ulong)((long)(local_58->args).
                                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar17 >> 5))
         && (paVar17[uVar18].descr != (char *)0x0)) {
        std::__cxx11::string::append(local_f0);
        std::__cxx11::string::append(local_f0);
      }
      uVar18 = uVar18 + 1;
    }
    else {
      if (cVar2 == '\0') break;
      std::__cxx11::string::push_back((char)local_f0);
    }
    pcVar9 = pcVar9 + 1;
  } while( true );
  if ((uVar18 != local_120) || (local_130[local_60] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar9 = strdup((char *)local_f0);
  pfVar19 = local_58;
  local_58->signature = pcVar9;
  std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  ::_M_shrink_to_fit(local_128);
  pfVar19->nargs = (uint16_t)local_120;
  pPVar13 = (pfVar19->sibling).m_ptr;
  if (pPVar13 != (PyObject *)0x0) {
    if (pPVar13->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar13 = (PyObject *)pPVar13[1].ob_refcnt;
      (pfVar19->sibling).m_ptr = pPVar13;
      if (pPVar13 == (PyObject *)0x0) goto LAB_0010bd6a;
    }
    iVar8 = _PyObject_TypeCheck(pPVar13,(PyTypeObject *)&PyCFunction_Type);
    if (iVar8 == 0) {
      if (((pfVar19->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*pfVar19->name != '_')) {
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff70,pfVar19->name,(allocator *)local_b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&signature.field_2 + 8),
                       "Cannot overload existing non-function object \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&signature.field_2 + 8),"\" with a function of the same name");
        pybind11_fail((string *)local_50);
      }
    }
    else {
      pPVar13 = (pfVar19->sibling).m_ptr;
      if ((*(byte *)(pPVar13[1].ob_refcnt + 0x10) & 0x20) == 0) {
        local_50 = (undefined1  [8])pPVar13[1].ob_type;
        if (local_50 != (undefined1  [8])0x0) {
          (((PyTypeObject *)local_50)->ob_base).ob_base.ob_refcnt =
               (((PyTypeObject *)local_50)->ob_base).ob_base.ob_refcnt + 1;
        }
      }
      else {
        local_50 = (undefined1  [8])0x0;
      }
      pfVar11 = capsule::operator_cast_to_function_record_((capsule *)local_50);
      pfVar19 = local_58;
      pPVar13 = (pfVar11->scope).m_ptr;
      pPVar14 = (local_58->scope).m_ptr;
      pybind11::object::~object((object *)local_50);
      if (pPVar13 == pPVar14) {
        pPVar13 = (pfVar19->sibling).m_ptr;
        (local_f8->super_function).super_object.super_handle.m_ptr = pPVar13;
        if (pPVar13 != (PyObject *)0x0) {
          pPVar13->ob_refcnt = pPVar13->ob_refcnt + 1;
        }
        pfVar5 = pfVar11;
        if (((pfVar11->field_0x59 ^ pfVar19->field_0x59) & 0x40) != 0) {
          pcVar9 = "instance";
          if ((pfVar19->field_0x59 & 0x40) == 0) {
            pcVar9 = "static";
          }
          std::__cxx11::string::string((string *)&local_1b8,pcVar9,&local_62);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118,
                         "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                         ,&local_1b8);
          std::operator+(&local_158,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118," method ");
          local_1d8.obj.m_ptr = (local_58->scope).m_ptr;
          local_1d8.key = "__name__";
          local_1d8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          str::str<pybind11::detail::accessor_policies::str_attr>(&local_138,&local_1d8);
          str::operator_cast_to_string(&local_198,&local_138);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,&local_158,&local_198);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,".");
          std::__cxx11::string::string((string *)&local_178,local_58->name,&local_61);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&signature.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff70,&local_178);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&signature.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
          pybind11_fail((string *)local_50);
        }
        do {
          pfVar15 = pfVar5;
          pfVar5 = pfVar15->next;
        } while (pfVar5 != (function_record *)0x0);
        pfVar15->next = pfVar19;
        psVar16 = &signatures._M_string_length;
        signatures._M_dataplus._M_p = (pointer)0x0;
        signatures._M_string_length = signatures._M_string_length & 0xffffffffffffff00;
        local_50 = (undefined1  [8])psVar16;
        if (DAT_001226d9 == 1) {
          std::__cxx11::string::append(local_50);
          std::__cxx11::string::append(local_50);
          psVar16 = (size_type *)std::__cxx11::string::append(local_50);
        }
        bVar20 = false;
        goto LAB_0010beb6;
      }
    }
  }
LAB_0010bd6a:
  pPVar12 = (PyMethodDef *)operator_new(0x20);
  pfVar19->def = pPVar12;
  *(undefined8 *)&pPVar12->ml_flags = 0;
  pPVar12->ml_doc = (char *)0x0;
  pPVar12->ml_name = pfVar19->name;
  pPVar12->ml_meth = dispatcher;
  pPVar12->ml_flags = 3;
  capsule::capsule((capsule *)((long)&signature.field_2 + 8),pfVar19,
                   initialize_generic::anon_class_1_0_00000001::__invoke);
  local_90._M_p = (pointer)0x0;
  obj.m_ptr = (pfVar19->scope).m_ptr;
  if (obj.m_ptr != (PyObject *)0x0) {
    bVar20 = hasattr(obj,"__module__");
    if (bVar20) {
      signatures._M_dataplus._M_p = (pointer)(pfVar19->scope).m_ptr;
      signatures._M_string_length = (size_type)anon_var_dwarf_32c73;
      signatures.field_2._M_allocated_capacity = 0;
      detail::accessor::operator_cast_to_object((accessor *)local_b0);
    }
    else {
      bVar20 = hasattr((pfVar19->scope).m_ptr,"__name__");
      if (!bVar20) goto LAB_0010be5a;
      signatures._M_dataplus._M_p = (pointer)(pfVar19->scope).m_ptr;
      signatures._M_string_length = (size_type)anon_var_dwarf_32937;
      signatures.field_2._M_allocated_capacity = 0;
      detail::accessor::operator_cast_to_object((accessor *)local_b0);
    }
    pybind11::object::operator=((object *)&stack0xffffffffffffff70,(object *)local_b0);
    pybind11::object::~object((object *)local_b0);
    pybind11::object::~object((object *)&signatures.field_2._M_allocated_capacity);
  }
LAB_0010be5a:
  pPVar13 = (PyObject *)PyCMethod_New(pfVar19->def,signature.field_2._8_8_,local_90._M_p,0);
  (local_f8->super_function).super_object.super_handle.m_ptr = pPVar13;
  if (pPVar13 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object((object *)&stack0xffffffffffffff70);
  pybind11::object::~object((object *)((long)&signature.field_2 + 8));
  local_50 = (undefined1  [8])&signatures._M_string_length;
  signatures._M_dataplus._M_p = (pointer)0x0;
  signatures._M_string_length = signatures._M_string_length & 0xffffffffffffff00;
  psVar16 = (size_type *)CONCAT71((int7)((ulong)local_50 >> 8),1);
  bVar20 = true;
  pfVar11 = pfVar19;
LAB_0010beb6:
  local_60 = CONCAT44(local_60._4_4_,(int)CONCAT71((int7)((ulong)psVar16 >> 8),1));
  iVar8 = 0;
  for (; pcVar7 = local_f8, pfVar11 != (function_record *)0x0; pfVar11 = pfVar11->next) {
    if (DAT_001226d9 == 1) {
      if (0 < iVar8) {
        std::__cxx11::string::append(local_50);
      }
      if (!bVar20) {
        iVar8 = iVar8 + 1;
        std::__cxx11::to_string((string *)&stack0xffffffffffffff70,iVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (signature.field_2._M_local_buf + 8),(string *)&stack0xffffffffffffff70,". ")
        ;
        std::__cxx11::string::append((string *)local_50);
        std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      }
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(local_50);
    }
    if (((pfVar11->doc != (char *)0x0) && (*pfVar11->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (((DAT_001226d9 | (byte)local_60) & 1) == 0) {
        std::__cxx11::string::append(local_50);
        local_60 = local_60 & 0xffffffff00000000;
      }
      else {
        local_60 = CONCAT44(local_60._4_4_,
                            CONCAT31((int3)(local_60 >> 8),(byte)local_60 & DAT_001226d9));
      }
      if ((DAT_001226d9 & 1) != 0) {
        std::__cxx11::string::append(local_50);
      }
      std::__cxx11::string::append(local_50);
      if (DAT_001226d9 == 1) {
        std::__cxx11::string::append(local_50);
      }
    }
  }
  pPVar13 = (local_f8->super_function).super_object.super_handle.m_ptr;
  free(*(void **)(pPVar13[1].ob_refcnt + 0x18));
  pcVar9 = strdup((char *)local_50);
  *(char **)(pPVar13[1].ob_refcnt + 0x18) = pcVar9;
  if ((local_58->field_0x59 & 0x40) != 0) {
    pPVar14 = (PyObject *)
              PyInstanceMethod_New((pcVar7->super_function).super_object.super_handle.m_ptr);
    (pcVar7->super_function).super_object.super_handle.m_ptr = pPVar14;
    if (pPVar14 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    _Py_DECREF(pPVar13);
  }
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_f0);
  return;
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = std::string(((PyTypeObject *) rec->scope.ptr())->tp_name);
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;

                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }